

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnterLibrary.cpp
# Opt level: O0

void __thiscall EnterLibrary::operator()(EnterLibrary *this)

{
  Session *this_00;
  bool bVar1;
  ostream *poVar2;
  char *cookie;
  void *this_01;
  HttpRequest *this_02;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70 [2];
  undefined1 local_50 [8];
  json Json;
  unsigned_short sign;
  Connection local_30 [8];
  string reply;
  EnterLibrary *this_local;
  
  bVar1 = Session::IsConnected((this->super_Event).m_Owner);
  if (bVar1) {
    this_02 = &(this->super_Event).m_Request;
    HttpRequest::SetRequest(this_02,"GET","/api/v1/tema/library/access","HTTP/1.1","");
    HttpRequest::SetHost(this_02,"ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
    HttpRequest::ClearHeaders(this_02);
    HttpRequest::AddHeader(this_02,"Connection","keep-alive");
    HttpRequest::ClearCookies(this_02);
    Session::GetConnectSid_abi_cxx11_((this->super_Event).m_Owner);
    cookie = (char *)std::__cxx11::string::c_str();
    HttpRequest::AddCookie(this_02,"connect.sid",cookie);
    HttpRequest::SetData(this_02,"");
    Session::OpenConnection((this->super_Event).m_Owner);
    HttpRequest::Send(this_02,(this->super_Event).m_Owner);
    Connection::ReceiveHttps_abi_cxx11_(local_30,(this->super_Event).m_Owner);
    Session::CloseConnection((this->super_Event).m_Owner);
    Json.m_value.number_unsigned._2_2_ = HttpReply::ExtractSign((string *)local_30);
    if (Json.m_value.number_integer._2_2_ == 200) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Enter library successfully");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_50,(nullptr_t)0x0);
      HttpReply::ExtractData
                ((string *)local_30,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_50);
      this_00 = (this->super_Event).m_Owner;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)local_50,"token");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_70);
      Session::SetToken(this_00,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_50);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Enter library failed ");
      poVar2 = std::operator<<(poVar2,"error ");
      this_01 = (void *)std::ostream::operator<<(poVar2,Json.m_value.number_unsigned._2_2_);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)local_30);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"You are not connected");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Please login to proceed this command");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void EnterLibrary::operator()() {
    using namespace std;
    if (!m_Owner->IsConnected()) {
        cout << "You are not connected" << endl;
        cout << "Please login to proceed this command" << endl;
        return;
    }
    m_Request.SetRequest("GET", "/api/v1/tema/library/access", "HTTP/1.1");
    m_Request.SetHost("ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
    m_Request.ClearHeaders();
    m_Request.AddHeader("Connection", "keep-alive");
    m_Request.ClearCookies();
    m_Request.AddCookie("connect.sid", m_Owner->GetConnectSid().c_str());
    m_Request.SetData("");
    m_Owner->OpenConnection();
    m_Request.Send(*m_Owner);
    std::string reply = Connection::ReceiveHttps(*m_Owner);
    m_Owner->CloseConnection();
    unsigned short sign = HttpReply::ExtractSign(reply);
    if (sign == 200) {
        cout << "Enter library successfully" << std::endl;
        json Json;
        HttpReply::ExtractData(reply, Json);
        m_Owner->SetToken(Json["token"]);
    }
    else {
        cout << "Enter library failed " << "error " << sign << std::endl;
    }
}